

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPage::setPixmap(QWizardPage *this,WizardPixmap which,QPixmap *pixmap)

{
  long lVar1;
  long lVar2;
  QWizardPage *pQVar3;
  long in_FS_OFFSET;
  QWizardPage *local_30;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QPixmap::operator=((QPixmap *)(lVar1 + (ulong)which * 0x18 + 0x290),pixmap);
  if (*(long *)(lVar1 + 600) != 0) {
    lVar2 = *(long *)(*(long *)(lVar1 + 600) + 8);
    local_24 = *(int *)(lVar2 + 0x340);
    local_30 = (QWizardPage *)0x0;
    pQVar3 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar2 + 0x2e0),&local_24,&local_30);
    if (pQVar3 == this) {
      QWizardPrivate::updatePixmap(*(QWizardPrivate **)(*(long *)(lVar1 + 600) + 8),which);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::setPixmap(QWizard::WizardPixmap which, const QPixmap &pixmap)
{
    Q_D(QWizardPage);
    Q_ASSERT(uint(which) < QWizard::NPixmaps);
    d->pixmaps[which] = pixmap;
    if (d->wizard && d->wizard->currentPage() == this)
        d->wizard->d_func()->updatePixmap(which);
}